

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

mempool * memory_allocate_mempool(uint32_t num_entries,uint32_t entry_size)

{
  long lVar1;
  uint uVar2;
  mempool *pmVar3;
  uintptr_t *puVar4;
  undefined8 extraout_RAX;
  uint extraout_EDX;
  ulong uVar5;
  undefined4 in_register_00000034;
  long lVar6;
  long lVar7;
  undefined4 in_register_0000003c;
  long *plVar8;
  uint uVar9;
  uintptr_t *virt;
  dma_memory dVar10;
  
  plVar8 = (long *)CONCAT44(in_register_0000003c,num_entries);
  lVar6 = CONCAT44(in_register_00000034,entry_size);
  uVar2 = 0x800;
  if (entry_size != 0) {
    uVar2 = entry_size;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % (ulong)uVar2) != 0)) {
    memory_allocate_mempool_cold_1();
    pmVar3 = (mempool *)(ulong)extraout_EDX;
    if (*(uint *)(plVar8 + 2) < extraout_EDX) {
      fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
              "pkt_buf_alloc_batch",plVar8,(ulong)*(uint *)(plVar8 + 2),pmVar3,extraout_RAX);
      pmVar3 = (mempool *)(ulong)*(uint *)(plVar8 + 2);
    }
    if ((int)pmVar3 != 0) {
      lVar1 = plVar8[1];
      uVar5 = (ulong)*(uint *)(plVar8 + 2);
      lVar7 = 0;
      do {
        uVar2 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar2;
        *(ulong *)(lVar6 + lVar7) =
             (ulong)(uint)(*(int *)((long)plVar8 + uVar5 * 4 + 0x14) * (int)lVar1) + *plVar8;
        lVar7 = lVar7 + 8;
      } while ((long)pmVar3 << 3 != lVar7);
      *(uint *)(plVar8 + 2) = uVar2;
    }
    return pmVar3;
  }
  pmVar3 = (mempool *)malloc((ulong)num_entries * 4 + 0x18);
  uVar9 = 0;
  dVar10 = memory_allocate_dma((ulong)(uVar2 * num_entries),false);
  pmVar3->num_entries = num_entries;
  pmVar3->buf_size = uVar2;
  pmVar3->base_addr = dVar10.virt;
  pmVar3->free_stack_top = num_entries;
  if (num_entries != 0) {
    uVar5 = 0;
    do {
      *(int *)(&pmVar3->field_0x14 + uVar5 * 4) = (int)uVar5;
      virt = (uintptr_t *)((ulong)uVar9 + (long)pmVar3->base_addr);
      puVar4 = virt;
      if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
        puVar4 = (uintptr_t *)virt_to_phys(virt);
      }
      *virt = (uintptr_t)puVar4;
      *(int *)(virt + 2) = (int)uVar5;
      virt[1] = (uintptr_t)pmVar3;
      *(undefined4 *)((long)virt + 0x14) = 0;
      uVar5 = uVar5 + 1;
      uVar9 = uVar9 + uVar2;
    } while (num_entries != uVar5);
  }
  return pmVar3;
}

Assistant:

struct mempool* memory_allocate_mempool(uint32_t num_entries, uint32_t entry_size) {
	entry_size = entry_size ? entry_size : 2048;
	// require entries that neatly fit into the page size, this makes the memory pool much easier
	// otherwise our base_addr + index * size formula would be wrong because we can't cross a page-boundary
	if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && HUGE_PAGE_SIZE % entry_size) {
		error("entry size must be a divisor of the huge page size (%d)", HUGE_PAGE_SIZE);
	}
	struct mempool* mempool = (struct mempool*) malloc(sizeof(struct mempool) + num_entries * sizeof(uint32_t));
	struct dma_memory mem = memory_allocate_dma(num_entries * entry_size, false);
	mempool->num_entries = num_entries;
	mempool->buf_size = entry_size;
	mempool->base_addr = mem.virt;
	mempool->free_stack_top = num_entries;
	for (uint32_t i = 0; i < num_entries; i++) {
		mempool->free_stack[i] = i;
		struct pkt_buf* buf = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + i * entry_size);
		if (VFIO_CONTAINER_FILE_DESCRIPTOR != -1) {
			// "physical" memory is iova address which is identity mapped to vaddr
			buf->buf_addr_phy = (uintptr_t) buf;
		} else {
			// physical addresses are not contiguous within a pool, we need to get the mapping
			// minor optimization opportunity: this only needs to be done once per page
			buf->buf_addr_phy = virt_to_phys(buf);
		}
		buf->mempool_idx = i;
		buf->mempool = mempool;
		buf->size = 0;
	}
	return mempool;
}